

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.h
# Opt level: O3

void __thiscall
cfd::api::json::DecodeRawTransactionTxOut::DecodeRawTransactionTxOut
          (DecodeRawTransactionTxOut *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_JsonClassBase<cfd::api::json::DecodeRawTransactionTxOut>)._vptr_JsonClassBase =
       (_func_int **)&PTR__DecodeRawTransactionTxOut_0072f5b8;
  p_Var1 = &(this->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->value_ = 0;
  this->n_ = 0;
  DecodeLockingScript::DecodeLockingScript(&this->script_pub_key_);
  CollectFieldName();
  return;
}

Assistant:

DecodeRawTransactionTxOut() {
    CollectFieldName();
  }